

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginManager.cpp
# Opt level: O0

string_view __thiscall
PluginGenericCommand::getHelp(PluginGenericCommand *this,string_view parameters)

{
  string_view sVar1;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  PluginGenericCommand *this_local;
  string_view parameters_local;
  char *local_10;
  
  bVar3 = sv("load",4);
  bVar2 = jessilib::equalsi<char,char>(parameters,bVar3);
  if (bVar2) {
    parameters_local._M_str = (char *)0x5a;
    local_10 = 
    "Loads a plugin by file name. Do not include a file extension. Syntax: plugin load <plugin>";
  }
  else {
    bVar3 = sv("unload",6);
    bVar2 = jessilib::equalsi<char,char>(parameters,bVar3);
    if (bVar2) {
      parameters_local._M_str = (char *)0x38;
      local_10 = "Unloads a plugin by name. Syntax: plugin unload <plugin>";
    }
    else {
      bVar3 = sv("list",4);
      bVar2 = jessilib::equalsi<char,char>(parameters,bVar3);
      if (bVar2) {
        parameters_local._M_str = (char *)0x40;
        local_10 = "Lists all of the plugins currently loaded. Syntax: plugin [list]";
      }
      else {
        parameters_local._M_str = (char *)0x5f;
        local_10 = 
        "Manages plugins. Syntax: plugin {[list], <load> <plugin>, <unload> <plugin>, <reload> [plugin]}"
        ;
      }
    }
  }
  sVar1._M_str = local_10;
  sVar1._M_len = (size_t)parameters_local._M_str;
  return sVar1;
}

Assistant:

std::string_view PluginGenericCommand::getHelp(std::string_view parameters) {
	static constexpr std::string_view loadHelp = "Loads a plugin by file name. Do not include a file extension. Syntax: plugin load <plugin>"sv;
	static constexpr std::string_view unloadHelp = "Unloads a plugin by name. Syntax: plugin unload <plugin>"sv;
	static constexpr std::string_view listHelp = "Lists all of the plugins currently loaded. Syntax: plugin [list]"sv;
	static constexpr std::string_view defaultHelp = "Manages plugins. Syntax: plugin {[list], <load> <plugin>, <unload> <plugin>, <reload> [plugin]}"sv;

	if (jessilib::equalsi(parameters, "load"sv)) {
		return loadHelp;
	}

	if (jessilib::equalsi(parameters, "unload"sv)) {
		return unloadHelp;
	}

	if (jessilib::equalsi(parameters, "list"sv)) {
		return listHelp;
	}

	return defaultHelp;
}